

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytraced_renderer.cpp
# Opt level: O0

void __thiscall CGL::RaytracedRenderer::visualize_accel(RaytracedRenderer *this)

{
  double dVar1;
  double dVar2;
  long lVar3;
  Color CVar4;
  Color CVar5;
  Color CVar6;
  Color CVar7;
  ulong uVar8;
  bool bVar9;
  const_reference ppBVar10;
  reference ppBVar11;
  size_type sVar12;
  const_reference pvVar13;
  double *pdVar14;
  long in_RDI;
  undefined1 auVar16 [12];
  undefined1 auVar15 [16];
  Vector3D end;
  double ray_t;
  size_t i;
  BVHNode *current;
  stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
  tstack;
  BVHNode *selected;
  float cprim_hl_edges_alpha;
  Color cprim_hl_edges;
  float cprim_hl_right_alpha;
  Color cprim_hl_right;
  float cprim_hl_left_alpha;
  Color cprim_hl_left;
  float cnode_hl_child_alpha;
  Color cnode_hl_child;
  float cnode_hl_alpha;
  Color cnode_hl;
  float cnode_alpha;
  Color cnode;
  undefined4 in_stack_fffffffffffffda8;
  float in_stack_fffffffffffffdac;
  stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
  *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  float in_stack_fffffffffffffdbc;
  int local_1d0 [14];
  Vector3D local_198;
  undefined8 local_170;
  ulong local_168;
  Color local_160;
  Color local_150;
  Color local_140;
  Color local_130;
  Color local_120;
  Color local_110;
  Color local_100;
  Color local_f0;
  value_type local_e0;
  BVHNode *local_c8;
  Color *local_70;
  float local_68;
  Color local_64;
  float local_58;
  Color local_54;
  float local_48;
  Color local_44;
  float local_38;
  Color local_34;
  float local_28;
  Color local_24;
  float local_18;
  Color local_14;
  
  glPushAttrib(0x2000);
  glDisable(0xb50);
  glLineWidth(0x3f800000);
  glEnable(0xb71);
  Color::Color(&local_14,0.5,0.5,0.5);
  local_18 = 0.25;
  Color::Color(&local_24,1.0,0.25,0.0);
  local_28 = 0.6;
  Color::Color(&local_34,1.0,1.0,1.0);
  local_38 = 0.6;
  Color::Color(&local_44,0.6,0.6,1.0);
  local_48 = 1.0;
  Color::Color(&local_54,0.8,0.8,1.0);
  local_58 = 1.0;
  Color::Color(&local_64,0.0,0.0,0.0);
  local_68 = 0.5;
  ppBVar10 = std::
             stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
             ::top((stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
                    *)0x15112a);
  local_70 = (Color *)*ppBVar10;
  glPolygonOffset(0x3f800000);
  glEnable(0x8037);
  bVar9 = SceneObjects::BVHNode::isLeaf((BVHNode *)local_70);
  if (bVar9) {
    CGL::SceneObjects::BVHAccel::draw(*(BVHNode **)(in_RDI + 0xd8),local_70,local_48);
  }
  else {
    CGL::SceneObjects::BVHAccel::draw
              (*(BVHNode **)(in_RDI + 0xd8),*(Color **)(local_70 + 8),local_48);
    CGL::SceneObjects::BVHAccel::draw
              (*(BVHNode **)(in_RDI + 0xd8),*(Color **)&local_70[8].b,local_58);
  }
  glDisable(0x8037);
  CGL::SceneObjects::BVHAccel::drawOutline(*(BVHNode **)(in_RDI + 0xd8),local_70,local_68);
  glDepthMask(0);
  std::
  stack<CGL::SceneObjects::BVHNode*,std::deque<CGL::SceneObjects::BVHNode*,std::allocator<CGL::SceneObjects::BVHNode*>>>
  ::stack<std::deque<CGL::SceneObjects::BVHNode*,std::allocator<CGL::SceneObjects::BVHNode*>>,void>
            (in_stack_fffffffffffffdb0);
  local_c8 = SceneObjects::BVHAccel::get_root(*(BVHAccel **)(in_RDI + 0xd8));
  std::
  stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
  ::push(in_stack_fffffffffffffdb0,
         (value_type *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  while (bVar9 = std::
                 stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
                 ::empty((stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
                          *)0x15128d), ((bVar9 ^ 0xffU) & 1) != 0) {
    ppBVar11 = std::
               stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
               ::top((stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
                      *)0x1512af);
    local_e0 = *ppBVar11;
    std::
    stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
    ::pop((stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
           *)0x1512d3);
    local_f0.b = local_14.b;
    local_f0.r = local_14.r;
    local_f0.g = local_14.g;
    local_100.b = local_14.b;
    local_100.r = local_14.r;
    local_100.g = local_14.g;
    CVar7.b = local_14.b;
    CVar7.r = local_14.r;
    CVar7.g = local_14.g;
    CGL::BBox::draw(CVar7,local_18);
    if (*(long *)(local_e0 + 0x60) != 0) {
      std::
      stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
      ::push(in_stack_fffffffffffffdb0,
             (value_type *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    }
    if (*(long *)(local_e0 + 0x68) != 0) {
      std::
      stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
      ::push(in_stack_fffffffffffffdb0,
             (value_type *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    }
  }
  lVar3._0_4_ = local_70[8].r;
  lVar3._4_4_ = local_70[8].g;
  if (lVar3 != 0) {
    local_110.b = local_34.b;
    local_110.r = local_34.r;
    local_110.g = local_34.g;
    local_120.b = local_34.b;
    local_120.r = local_34.r;
    local_120.g = local_34.g;
    CVar6.b = local_34.b;
    CVar6.r = local_34.r;
    CVar6.g = local_34.g;
    CGL::BBox::draw(CVar6,local_38);
  }
  if (*(long *)&local_70[8].b != 0) {
    local_130.b = local_34.b;
    local_130.r = local_34.r;
    local_130.g = local_34.g;
    local_140.b = local_34.b;
    local_140.r = local_34.r;
    local_140.g = local_34.g;
    CVar5.b = local_34.b;
    CVar5.r = local_34.r;
    CVar5.g = local_34.g;
    CGL::BBox::draw(CVar5,local_38);
  }
  glLineWidth(0x40400000);
  local_150.b = local_24.b;
  local_150.r = local_24.r;
  local_150.g = local_24.g;
  local_160.b = local_24.b;
  local_160.r = local_24.r;
  local_160.g = local_24.g;
  CVar4.b = local_24.b;
  CVar4.r = local_24.r;
  CVar4.g = local_24.g;
  CGL::BBox::draw(CVar4,local_28);
  if ((*(byte *)(in_RDI + 0x278) & 1) != 0) {
    glLineWidth(0x3f800000);
    glBegin(1);
    for (local_168 = 0; uVar8 = local_168,
        sVar12 = std::vector<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_>::size
                           ((vector<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_> *)
                            (in_RDI + 0x260)), uVar8 < sVar12; local_168 = local_168 + 500) {
      local_170 = 0x40f86a0000000000;
      pvVar13 = std::vector<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_>::operator[]
                          ((vector<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_> *)
                           (in_RDI + 0x260),local_168);
      if (*(double *)(pvVar13 + 0x40) < 0.0) {
        auVar16 = SUB1612(ZEXT816(0) << 0x40,4);
        glColor4f(0x3f800000,0,0,0x3dcccccd);
      }
      else {
        pvVar13 = std::vector<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_>::operator[]
                            ((vector<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_> *)
                             (in_RDI + 0x260),local_168);
        local_170 = *(undefined8 *)(pvVar13 + 0x40);
        auVar16 = SUB1612(ZEXT816(0) << 0x40,4);
        glColor4f(0x3f800000,0x3f800000,0,0x3dcccccd);
      }
      std::vector<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_>::operator[]
                ((vector<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_> *)(in_RDI + 0x260),
                 local_168);
      std::vector<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_>::operator[]
                ((vector<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_> *)(in_RDI + 0x260),
                 local_168);
      CGL::operator*((double *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                     (Vector3D *)in_stack_fffffffffffffdb0);
      Vector3D::operator+((Vector3D *)in_stack_fffffffffffffdb0,
                          (Vector3D *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8))
      ;
      pvVar13 = std::vector<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_>::operator[]
                          ((vector<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_> *)
                           (in_RDI + 0x260),local_168);
      local_1d0[5] = 0;
      pdVar14 = Vector3D::operator[]((Vector3D *)pvVar13,local_1d0 + 5);
      dVar1 = *pdVar14;
      pvVar13 = std::vector<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_>::operator[]
                          ((vector<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_> *)
                           (in_RDI + 0x260),local_168);
      local_1d0[4] = 1;
      pdVar14 = Vector3D::operator[]((Vector3D *)pvVar13,local_1d0 + 4);
      dVar2 = *pdVar14;
      pvVar13 = std::vector<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_>::operator[]
                          ((vector<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_> *)
                           (in_RDI + 0x260),local_168);
      local_1d0[3] = 2;
      pdVar14 = Vector3D::operator[]((Vector3D *)pvVar13,local_1d0 + 3);
      auVar15._0_4_ = (float)*pdVar14;
      auVar15._4_12_ = auVar16;
      glVertex3f((float)dVar1,(float)dVar2,auVar15._0_8_);
      local_1d0[2] = 0;
      pdVar14 = Vector3D::operator[](&local_198,local_1d0 + 2);
      in_stack_fffffffffffffdbc = (float)*pdVar14;
      local_1d0[1] = 1;
      pdVar14 = Vector3D::operator[](&local_198,local_1d0 + 1);
      in_stack_fffffffffffffdac = (float)*pdVar14;
      local_1d0[0] = 2;
      in_stack_fffffffffffffdb0 =
           (stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
            *)Vector3D::operator[](&local_198,local_1d0);
      glVertex3f(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdac);
    }
    glEnd();
  }
  glDepthMask(1);
  glPopAttrib();
  std::
  stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
  ::~stack((stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
            *)0x1518b2);
  return;
}

Assistant:

void RaytracedRenderer::visualize_accel() const {

  glPushAttrib(GL_ENABLE_BIT);
  glDisable(GL_LIGHTING);
  glLineWidth(1);
  glEnable(GL_DEPTH_TEST);

  // hardcoded color settings
  Color cnode = Color(.5, .5, .5); float cnode_alpha = 0.25f;
  Color cnode_hl = Color(1., .25, .0); float cnode_hl_alpha = 0.6f;
  Color cnode_hl_child = Color(1., 1., 1.); float cnode_hl_child_alpha = 0.6f;

  Color cprim_hl_left = Color(.6, .6, 1.); float cprim_hl_left_alpha = 1.f;
  Color cprim_hl_right = Color(.8, .8, 1.); float cprim_hl_right_alpha = 1.f;
  Color cprim_hl_edges = Color(0., 0., 0.); float cprim_hl_edges_alpha = 0.5f;

  BVHNode *selected = selectionHistory.top();

  // render solid geometry (with depth offset)
  glPolygonOffset(1.0, 1.0);
  glEnable(GL_POLYGON_OFFSET_FILL);

  if (selected->isLeaf()) {
    bvh->draw(selected, cprim_hl_left, cprim_hl_left_alpha);
  } else {
    bvh->draw(selected->l, cprim_hl_left, cprim_hl_left_alpha);
    bvh->draw(selected->r, cprim_hl_right, cprim_hl_right_alpha);
  }

  glDisable(GL_POLYGON_OFFSET_FILL);

  // draw geometry outline
  bvh->drawOutline(selected, cprim_hl_edges, cprim_hl_edges_alpha);

  // keep depth buffer check enabled so that mesh occluded bboxes, but
  // disable depth write so that bboxes don't occlude each other.
  glDepthMask(GL_FALSE);

  // create traversal stack
  stack<BVHNode *> tstack;

  // push initial traversal data
  tstack.push(bvh->get_root());

  // draw all BVH bboxes with non-highlighted color
  while (!tstack.empty()) {

    BVHNode *current = tstack.top();
    tstack.pop();

    current->bb.draw(cnode, cnode_alpha);
    if (current->l) tstack.push(current->l);
    if (current->r) tstack.push(current->r);
  }

  // draw selected node bbox and primitives
  if (selected->l) selected->l->bb.draw(cnode_hl_child, cnode_hl_child_alpha);
  if (selected->r) selected->r->bb.draw(cnode_hl_child, cnode_hl_child_alpha);

  glLineWidth(3.f);
  selected->bb.draw(cnode_hl, cnode_hl_alpha);

  // now perform visualization of the rays
  if (show_rays) {
      glLineWidth(1.f);
      glBegin(GL_LINES);

      for (size_t i=0; i<rayLog.size(); i+=500) {

          const static double VERY_LONG = 10e4;
          double ray_t = VERY_LONG;

          // color rays that are hits yellow
          // and rays this miss all geometry red
          if (rayLog[i].hit_t >= 0.0) {
              ray_t = rayLog[i].hit_t;
              glColor4f(1.f, 1.f, 0.f, 0.1f);
          } else {
              glColor4f(1.f, 0.f, 0.f, 0.1f);
          }

          Vector3D end = rayLog[i].o + ray_t * rayLog[i].d;

          glVertex3f(rayLog[i].o[0], rayLog[i].o[1], rayLog[i].o[2]);
          glVertex3f(end[0], end[1], end[2]);
      }
      glEnd();
  }

  glDepthMask(GL_TRUE);
  glPopAttrib();
}